

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  ENetPeer *peer;
  size_t sVar1;
  ENetChannel *pEVar2;
  uint uVar3;
  size_t sVar4;
  enet_uint32 *peVar5;
  ENetChannel *pEVar6;
  ENetProtocol command;
  
  sVar1 = 0xff;
  if (channelCount < 0xff) {
    sVar1 = channelCount;
  }
  sVar4 = 1;
  if (channelCount != 0) {
    sVar4 = sVar1;
  }
  peVar5 = &host->peers->windowSize;
  while( true ) {
    peer = (ENetPeer *)(peVar5 + -0x35);
    if (host->peers + host->peerCount <= peer) {
      return (ENetPeer *)0x0;
    }
    if (peVar5[-0x27] == ENET_PEER_STATE_DISCONNECTED) break;
    peVar5 = peVar5 + 0x72;
  }
  pEVar2 = (ENetChannel *)enet_malloc(sVar4 * 0x50);
  *(ENetChannel **)(peVar5 + -0x25) = pEVar2;
  if (pEVar2 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  *(size_t *)(peVar5 + -0x23) = sVar4;
  peVar5[-0x27] = ENET_PEER_STATE_CONNECTING;
  *(ENetAddress *)(peVar5 + -0x2c) = *address;
  uVar3 = host->randomSeed + 1;
  host->randomSeed = uVar3;
  peVar5[-0x2e] = uVar3;
  pEVar6 = pEVar2;
  if (host->outgoingBandwidth != 0) {
    uVar3 = host->outgoingBandwidth >> 4 & 0xffff000;
    *peVar5 = uVar3;
    if (uVar3 == 0) {
      *peVar5 = 0x1000;
      goto LAB_00157d20;
    }
    if (uVar3 < 0x10001) goto LAB_00157d20;
  }
  *peVar5 = 0x10000;
LAB_00157d20:
  for (; pEVar6 < pEVar2 + sVar4; pEVar6 = pEVar6 + 1) {
    pEVar6->outgoingReliableSequenceNumber = 0;
    pEVar6->outgoingUnreliableSequenceNumber = 0;
    pEVar6->incomingReliableSequenceNumber = 0;
    pEVar6->incomingUnreliableSequenceNumber = 0;
    enet_list_clear(&pEVar6->incomingReliableCommands);
    enet_list_clear(&pEVar6->incomingUnreliableCommands);
    pEVar6->reliableWindows[0xf] = 0;
    pEVar6->reliableWindows[7] = 0;
    pEVar6->reliableWindows[8] = 0;
    pEVar6->reliableWindows[9] = 0;
    pEVar6->reliableWindows[10] = 0;
    pEVar6->reliableWindows[0xb] = 0;
    pEVar6->reliableWindows[0xc] = 0;
    pEVar6->reliableWindows[0xd] = 0;
    pEVar6->reliableWindows[0xe] = 0;
    pEVar6->usedReliableWindows = 0;
    pEVar6->reliableWindows[0] = 0;
    pEVar6->reliableWindows[1] = 0;
    pEVar6->reliableWindows[2] = 0;
    pEVar6->reliableWindows[3] = 0;
    pEVar6->reliableWindows[4] = 0;
    pEVar6->reliableWindows[5] = 0;
    pEVar6->reliableWindows[6] = 0;
    pEVar2 = *(ENetChannel **)(peVar5 + -0x25);
  }
  command._0_2_ = 0xff82;
  command.acknowledge.receivedReliableSequenceNumber =
       *(enet_uint16 *)((long)peVar5 + -0xba) << 8 | *(enet_uint16 *)((long)peVar5 + -0xba) >> 8;
  command.connect.incomingSessionID = *(enet_uint8 *)((long)peVar5 + -0xb3);
  command.connect.outgoingSessionID = *(undefined1 *)(peVar5 + -0x2d);
  uVar3 = peVar5[-1];
  command.connect.mtu =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *peVar5;
  command.connect.windowSize =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  command.connect.channelCount = (int)sVar4 << 0x18;
  uVar3 = host->incomingBandwidth;
  command.connect.incomingBandwidth =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = host->outgoingBandwidth;
  command.connect.outgoingBandwidth =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = peVar5[-0xc];
  command.connect.packetThrottleInterval =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = peVar5[-0xe];
  command.connect.packetThrottleAcceleration =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = peVar5[-0xd];
  command.connect.packetThrottleDeceleration =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  command.connect.connectID = peVar5[-0x2e];
  command.connect.data = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18
  ;
  enet_peer_queue_outgoing_command(peer,&command,(ENetPacket *)0x0,0,0);
  return peer;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (currentPeer >= & host -> peers [host -> peerCount])
      return NULL;

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_16 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}